

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void insertCell(MemPage *pPage,int i,u8 *pCell,int sz,u8 *pTemp,Pgno iChild,int *pRC)

{
  byte bVar1;
  u8 uVar2;
  u8 *puVar3;
  int iVar4;
  u8 *__src;
  int rc;
  u8 *pIns;
  u8 *data;
  int local_38;
  int j;
  int idx;
  Pgno iChild_local;
  u8 *pTemp_local;
  u8 *puStack_20;
  int sz_local;
  u8 *pCell_local;
  MemPage *pMStack_10;
  int i_local;
  MemPage *pPage_local;
  
  local_38 = 0;
  j = iChild;
  _idx = pTemp;
  pTemp_local._4_4_ = sz;
  puStack_20 = pCell;
  pCell_local._4_4_ = i;
  pMStack_10 = pPage;
  if ((pPage->nOverflow == '\0') && (sz + 2 <= pPage->nFree)) {
    iVar4 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar4 == 0) {
      puVar3 = pMStack_10->aData;
      iVar4 = allocateSpace(pMStack_10,pTemp_local._4_4_,&local_38);
      if (iVar4 == 0) {
        pMStack_10->nFree = pMStack_10->nFree - (pTemp_local._4_4_ + 2U & 0xffff);
        if (j == 0) {
          memcpy(puVar3 + local_38,puStack_20,(long)pTemp_local._4_4_);
        }
        else {
          memcpy(puVar3 + (local_38 + 4),puStack_20 + 4,(long)(pTemp_local._4_4_ + -4));
          sqlite3Put4byte(puVar3 + local_38,j);
        }
        __src = pMStack_10->aCellIdx + (pCell_local._4_4_ << 1);
        memmove(__src + 2,__src,(long)(int)(((uint)pMStack_10->nCell - pCell_local._4_4_) * 2));
        *__src = (u8)((uint)local_38 >> 8);
        __src[1] = (u8)local_38;
        pMStack_10->nCell = pMStack_10->nCell + 1;
        iVar4 = pMStack_10->hdrOffset + 4;
        uVar2 = puVar3[iVar4];
        puVar3[iVar4] = uVar2 + '\x01';
        if ((u8)(uVar2 + '\x01') == '\0') {
          iVar4 = pMStack_10->hdrOffset + 3;
          puVar3[iVar4] = puVar3[iVar4] + '\x01';
        }
        if (pMStack_10->pBt->autoVacuum != '\0') {
          ptrmapPutOvflPtr(pMStack_10,pMStack_10,puStack_20,pRC);
        }
      }
      else {
        *pRC = iVar4;
      }
    }
    else {
      *pRC = iVar4;
    }
  }
  else {
    if (pTemp != (u8 *)0x0) {
      memcpy(pTemp,pCell,(long)sz);
      puStack_20 = _idx;
    }
    if (j != 0) {
      sqlite3Put4byte(puStack_20,j);
    }
    bVar1 = pMStack_10->nOverflow;
    pMStack_10->nOverflow = bVar1 + 1;
    pMStack_10->apOvfl[(int)(uint)bVar1] = puStack_20;
    pMStack_10->aiOvfl[(int)(uint)bVar1] = (u16)pCell_local._4_4_;
  }
  return;
}

Assistant:

static void insertCell(
  MemPage *pPage,   /* Page into which we are copying */
  int i,            /* New cell becomes the i-th cell of the page */
  u8 *pCell,        /* Content of the new cell */
  int sz,           /* Bytes of content in pCell */
  u8 *pTemp,        /* Temp storage space for pCell, if needed */
  Pgno iChild,      /* If non-zero, replace first 4 bytes with this value */
  int *pRC          /* Read and write return code from here */
){
  int idx = 0;      /* Where to write new cell content in data[] */
  int j;            /* Loop counter */
  u8 *data;         /* The content of the whole page */
  u8 *pIns;         /* The point in pPage->aCellIdx[] where no cell inserted */

  assert( *pRC==SQLITE_OK );
  assert( i>=0 && i<=pPage->nCell+pPage->nOverflow );
  assert( MX_CELL(pPage->pBt)<=10921 );
  assert( pPage->nCell<=MX_CELL(pPage->pBt) || CORRUPT_DB );
  assert( pPage->nOverflow<=ArraySize(pPage->apOvfl) );
  assert( ArraySize(pPage->apOvfl)==ArraySize(pPage->aiOvfl) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  /* The cell should normally be sized correctly.  However, when moving a
  ** malformed cell from a leaf page to an interior page, if the cell size
  ** wanted to be less than 4 but got rounded up to 4 on the leaf, then size
  ** might be less than 8 (leaf-size + pointer) on the interior node.  Hence
  ** the term after the || in the following assert(). */
  assert( sz==pPage->xCellSize(pPage, pCell) || (sz==8 && iChild>0) );
  assert( pPage->nFree>=0 );
  if( pPage->nOverflow || sz+2>pPage->nFree ){
    if( pTemp ){
      memcpy(pTemp, pCell, sz);
      pCell = pTemp;
    }
    if( iChild ){
      put4byte(pCell, iChild);
    }
    j = pPage->nOverflow++;
    /* Comparison against ArraySize-1 since we hold back one extra slot
    ** as a contingency.  In other words, never need more than 3 overflow
    ** slots but 4 are allocated, just to be safe. */
    assert( j < ArraySize(pPage->apOvfl)-1 );
    pPage->apOvfl[j] = pCell;
    pPage->aiOvfl[j] = (u16)i;

    /* When multiple overflows occur, they are always sequential and in
    ** sorted order.  This invariants arise because multiple overflows can
    ** only occur when inserting divider cells into the parent page during
    ** balancing, and the dividers are adjacent and sorted.
    */
    assert( j==0 || pPage->aiOvfl[j-1]<(u16)i ); /* Overflows in sorted order */
    assert( j==0 || i==pPage->aiOvfl[j-1]+1 );   /* Overflows are sequential */
  }else{
    int rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc!=SQLITE_OK ){
      *pRC = rc;
      return;
    }
    assert( sqlite3PagerIswriteable(pPage->pDbPage) );
    data = pPage->aData;
    assert( &data[pPage->cellOffset]==pPage->aCellIdx );
    rc = allocateSpace(pPage, sz, &idx);
    if( rc ){ *pRC = rc; return; }
    /* The allocateSpace() routine guarantees the following properties
    ** if it returns successfully */
    assert( idx >= 0 );
    assert( idx >= pPage->cellOffset+2*pPage->nCell+2 || CORRUPT_DB );
    assert( idx+sz <= (int)pPage->pBt->usableSize );
    pPage->nFree -= (u16)(2 + sz);
    if( iChild ){
      /* In a corrupt database where an entry in the cell index section of
      ** a btree page has a value of 3 or less, the pCell value might point
      ** as many as 4 bytes in front of the start of the aData buffer for
      ** the source page.  Make sure this does not cause problems by not
      ** reading the first 4 bytes */
      memcpy(&data[idx+4], pCell+4, sz-4);
      put4byte(&data[idx], iChild);
    }else{
      memcpy(&data[idx], pCell, sz);
    }
    pIns = pPage->aCellIdx + i*2;
    memmove(pIns+2, pIns, 2*(pPage->nCell - i));
    put2byte(pIns, idx);
    pPage->nCell++;
    /* increment the cell count */
    if( (++data[pPage->hdrOffset+4])==0 ) data[pPage->hdrOffset+3]++;
    assert( get2byte(&data[pPage->hdrOffset+3])==pPage->nCell || CORRUPT_DB );
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pPage->pBt->autoVacuum ){
      /* The cell may contain a pointer to an overflow page. If so, write
      ** the entry for the overflow page into the pointer map.
      */
      ptrmapPutOvflPtr(pPage, pPage, pCell, pRC);
    }
#endif
  }
}